

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::cgi_forwarder::on_header_sent
          (cgi_forwarder *this,error_code *e,size_t n)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  size_type in_RDX;
  error_code *in_RSI;
  size_type in_RDI;
  cgi_forwarder *in_stack_00000070;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  size_type __new_size;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if ((!bVar1) && (__new_size = in_RDX, sVar3 = std::__cxx11::string::size(), in_RDX == sVar3)) {
    std::__cxx11::string::clear();
    peVar4 = std::
             __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3822f1);
    iVar2 = (*peVar4->_vptr_connection[0x1b])();
    *(ulong *)(in_RDI + 0x58) = CONCAT44(extraout_var,iVar2);
    if (*(long *)(in_RDI + 0x58) < 1) {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
      read_response(in_stack_00000070);
    }
    else {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_RSI,__new_size,
                 (value_type_conflict *)(ulong)in_stack_ffffffffffffffe0);
      write_post((cgi_forwarder *)n);
    }
  }
  return;
}

Assistant:

void on_header_sent(booster::system::error_code const &e,size_t n)
		{
			if(e || n!=header_.size())
				return;
			header_.clear();
			content_length_ = conn_->env_content_length();
			if(content_length_ > 0) {
				post_.resize( content_length_ > 8192 ? 8192 : content_length_,0);
				write_post();
			}
			else {
				response_.resize(8192);
				read_response();
			}
		}